

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int ARKodeSetMassLinearSolver(void *arkode_mem,SUNLinearSolver LS,SUNMatrix M,int time_dep)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint *__s;
  long lVar5;
  N_Vector *v;
  int error_code;
  char *pcVar6;
  bool bVar7;
  
  if (arkode_mem == (void *)0x0) {
    pcVar6 = "arkode_mem = NULL illegal.";
    iVar4 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar3 = 0x142;
LAB_00143b91:
    arkProcessError((ARKodeMem)arkode_mem,error_code,iVar3,"ARKodeSetMassLinearSolver",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,pcVar6);
    return iVar4;
  }
  if (*(int *)((long)arkode_mem + 0x200) == 0) {
    pcVar6 = "time-stepping module does not support non-identity mass matrices";
    iVar4 = -0x30;
    error_code = -0x30;
    iVar3 = 0x14b;
    goto LAB_00143b91;
  }
  if (LS == (SUNLinearSolver)0x0) {
    pcVar6 = "LS must be non-NULL";
    iVar4 = -3;
    error_code = -3;
    iVar3 = 0x152;
    goto LAB_00143b91;
  }
  if ((LS->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
     (LS->ops->solve == (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_sunrealtype *)0x0)) {
    pcVar6 = "LS object is missing a required operation";
    iVar4 = -3;
    error_code = -3;
    iVar3 = 0x15a;
    goto LAB_00143b91;
  }
  uVar2 = SUNLinSolGetType(LS);
  bVar7 = (uVar2 - 1 & 0xfffffffd) != 0;
  lVar5 = *(long *)(*(long *)((long)arkode_mem + 0x268) + 8);
  if ((*(long *)(lVar5 + 0x60) == 0) || (*(long *)(lVar5 + 0xa8) == 0)) {
    pcVar6 = "A required vector operation is not implemented.";
    iVar4 = -3;
    error_code = -3;
    iVar3 = 0x16b;
    goto LAB_00143b91;
  }
  if (M != (SUNMatrix)0x0 && uVar2 == 3) {
    pcVar6 = "Incompatible inputs: matrix-embedded LS requires NULL matrix";
    iVar4 = -3;
    error_code = -3;
    iVar3 = 0x173;
    goto LAB_00143b91;
  }
  if (uVar2 == 0) {
    if (M == (SUNMatrix)0x0) {
      pcVar6 = "Incompatible inputs: direct LS requires non-NULL matrix";
      iVar4 = -3;
      error_code = -3;
      iVar3 = 0x194;
      goto LAB_00143b91;
    }
  }
  else {
    if (*(long *)(lVar5 + 0x48) == 0) {
      pcVar6 = "A required vector operation is not implemented.";
      iVar4 = -3;
      error_code = -3;
      iVar3 = 0x17d;
      goto LAB_00143b91;
    }
    if (((uVar2 != 3) != bVar7) &&
       (LS->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0)) {
      pcVar6 = "Incompatible inputs: iterative LS must support ATimes routine";
      iVar4 = -3;
      error_code = -3;
      iVar3 = 0x185;
      goto LAB_00143b91;
    }
    if ((M == (SUNMatrix)0x0) && ((uVar2 | 2) != 3)) {
      pcVar6 = "Incompatible inputs: matrix-iterative LS requires non-NULL matrix";
      iVar4 = -3;
      error_code = -3;
      iVar3 = 0x18c;
      goto LAB_00143b91;
    }
  }
  if ((*(long *)((long)arkode_mem + 0x208) == 0) || (*(long *)((long)arkode_mem + 0x218) == 0)) {
    pcVar6 = "Missing time step module or associated routines";
    iVar4 = -3;
    error_code = -3;
    iVar3 = 0x19c;
    goto LAB_00143b91;
  }
  __s = (uint *)malloc(0xe8);
  if (__s == (uint *)0x0) {
    pcVar6 = "A memory request failed.";
    iVar4 = -4;
    error_code = -4;
    iVar3 = 0x1a6;
    goto LAB_00143b91;
  }
  memset(__s,0,0xe8);
  *(SUNLinearSolver *)(__s + 0x24) = LS;
  *__s = (uint)(uVar2 != 0);
  __s[1] = (uint)bVar7;
  __s[0xe] = time_dep;
  __s[2] = 0;
  __s[3] = 0;
  __s[8] = 0;
  __s[9] = 0;
  __s[0x2a] = 0;
  __s[0x2b] = 0;
  __s[0x2c] = 0;
  __s[0x2d] = 0;
  __s[0x2e] = 0;
  __s[0x2f] = 0;
  __s[0x32] = 0;
  __s[0x33] = 0;
  __s[0x34] = 0;
  __s[0x35] = 0;
  __s[0x36] = 0;
  __s[0x37] = 0;
  *(undefined8 *)(__s + 0x30) = *(undefined8 *)((long)arkode_mem + 0x10);
  __s[0x22] = 0;
  __s[0x23] = 0;
  __s[0x1e] = 0;
  __s[0x1f] = 0;
  __s[0x20] = 0;
  __s[0x21] = 0;
  __s[0x1a] = 0;
  __s[0x1b] = 0;
  __s[0x1c] = 0;
  __s[0x1d] = 0;
  __s[0x16] = 0;
  __s[0x17] = 0;
  __s[0x18] = 0;
  __s[0x19] = 0;
  __s[0x12] = 0;
  __s[0x13] = 0;
  __s[0x14] = 0;
  __s[0x15] = 0;
  __s[0x10] = 0xffffffff;
  __s[0x11] = 0xffefffff;
  __s[10] = 0x9999999a;
  __s[0xb] = 0x3fa99999;
  __s[0x38] = 0;
  if ((LS->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) ||
     (iVar3 = SUNLinSolSetATimes(LS,arkode_mem,0), iVar3 == 0)) {
    if ((LS->ops->setpreconditioner ==
         (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) ||
       (iVar3 = SUNLinSolSetPreconditioner(LS,arkode_mem,0,0), iVar3 == 0)) {
      if (M != (SUNMatrix)0x0) {
        *(SUNMatrix *)(__s + 4) = M;
        if (uVar2 == 0) {
          lVar5 = SUNMatClone(M);
          *(long *)(__s + 6) = lVar5;
          if (lVar5 == 0) {
            iVar4 = -4;
            arkProcessError((ARKodeMem)arkode_mem,-4,0x1f0,"ARKodeSetMassLinearSolver",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                            ,"A memory request failed.");
            goto LAB_0014401d;
          }
        }
        else {
          *(SUNMatrix *)(__s + 6) = M;
        }
      }
      v = (N_Vector *)(__s + 0x26);
      iVar3 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x268),v);
      if (iVar3 == 0) {
        iVar4 = -4;
        arkProcessError((ARKodeMem)arkode_mem,-4,0x1fd,"ARKodeSetMassLinearSolver",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                        ,"A memory request failed.");
      }
      else {
        if (uVar2 != 0) {
          lVar5 = N_VGetLength(*v);
          if (lVar5 < 1) {
            dVar1 = 0.0;
          }
          else {
            lVar5 = N_VGetLength(*v);
            dVar1 = (double)lVar5;
            if (dVar1 < 0.0) {
              dVar1 = sqrt(dVar1);
            }
            else {
              dVar1 = SQRT(dVar1);
            }
          }
          *(double *)(__s + 0xc) = dVar1;
        }
        iVar4 = (**(code **)((long)arkode_mem + 0x208))
                          (arkode_mem,arkLsMassInitialize,arkLsMassSetup,arkLsMTimes,arkLsMassSolve,
                           arkLsMassFree,time_dep,uVar2,__s);
        if (iVar4 == 0) {
          return 0;
        }
        arkProcessError((ARKodeMem)arkode_mem,iVar4,0x20f,"ARKodeSetMassLinearSolver",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                        ,"Failed to attach to time stepper module");
        N_VDestroy(*v);
      }
      if (uVar2 == 0) {
        SUNMatDestroy(*(undefined8 *)(__s + 6));
      }
      goto LAB_0014401d;
    }
    pcVar6 = "Error in calling SUNLinSolSetPreconditioner";
    iVar3 = 0x1de;
  }
  else {
    pcVar6 = "Error in calling SUNLinSolSetATimes";
    iVar3 = 0x1d0;
  }
  iVar4 = -0xc;
  arkProcessError((ARKodeMem)arkode_mem,-0xc,iVar3,"ARKodeSetMassLinearSolver",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,pcVar6);
LAB_0014401d:
  free(__s);
  return iVar4;
}

Assistant:

int ARKodeSetMassLinearSolver(void* arkode_mem, SUNLinearSolver LS, SUNMatrix M,
                              sunbooleantype time_dep)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;
  SUNLinearSolver_Type LSType;
  sunbooleantype iterative;   /* is the solver iterative?    */
  sunbooleantype matrixbased; /* is a matrix structure used? */

  /* Return immediately if either arkode_mem or LS inputs are NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  if (LS == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS must be non-NULL");
    return (ARKLS_ILL_INPUT);
  }

  /* Test if solver is compatible with LS interface */
  if ((LS->ops->gettype == NULL) || (LS->ops->solve == NULL))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS object is missing a required operation");
    return (ARKLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = ((LSType != SUNLINEARSOLVER_ITERATIVE) &&
                 (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED));

  /* Test if vector is compatible with LS interface */
  if ((ark_mem->tempv1->ops->nvconst == NULL) ||
      (ark_mem->tempv1->ops->nvwrmsnorm == NULL))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_NVECTOR);
    return (ARKLS_ILL_INPUT);
  }

  /* Ensure that M is NULL when LS is matrix-embedded */
  if ((LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED) && (M != NULL))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Incompatible inputs: matrix-embedded LS requires NULL matrix");
    return (ARKLS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative)
  {
    if (ark_mem->tempv1->ops->nvgetlength == NULL)
    {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_LS_BAD_NVECTOR);
      return (ARKLS_ILL_INPUT);
    }

    if (!matrixbased && (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (LS->ops->setatimes == NULL))
    {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Incompatible inputs: iterative LS must support ATimes routine");
      return (ARKLS_ILL_INPUT);
    }

    if (matrixbased && (M == NULL))
    {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Incompatible inputs: matrix-iterative LS requires "
                      "non-NULL matrix");
      return (ARKLS_ILL_INPUT);
    }
  }
  else if (M == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Incompatible inputs: direct LS requires non-NULL matrix");
    return (ARKLS_ILL_INPUT);
  }

  /* Test whether time stepper module is supplied, with required routines */
  if ((ark_mem->step_attachmasssol == NULL) || (ark_mem->step_getmassmem == NULL))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Missing time step module or associated routines");
    return (ARKLS_ILL_INPUT);
  }

  /* Allocate memory for ARKLsMemRec */
  arkls_mem = NULL;
  arkls_mem = (ARKLsMassMem)malloc(sizeof(struct ARKLsMassMemRec));
  if (arkls_mem == NULL)
  {
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }
  memset(arkls_mem, 0, sizeof(struct ARKLsMassMemRec));

  /* set SUNLinearSolver pointer */
  arkls_mem->LS = LS;

  /* Linear solver type information */
  arkls_mem->iterative   = iterative;
  arkls_mem->matrixbased = matrixbased;

  /* Set flag indicating time-dependence */
  arkls_mem->time_dependent = time_dep;

  /* Set mass-matrix routines to NULL */
  arkls_mem->mass    = NULL;
  arkls_mem->M_data  = NULL;
  arkls_mem->mtsetup = NULL;
  arkls_mem->mtimes  = NULL;
  arkls_mem->mt_data = NULL;

  /* Set defaults for preconditioner-related fields */
  arkls_mem->pset   = NULL;
  arkls_mem->psolve = NULL;
  arkls_mem->pfree  = NULL;
  arkls_mem->P_data = ark_mem->user_data;

  /* Initialize counters */
  arkLsInitializeMassCounters(arkls_mem);

  /* Set default values for the rest of the LS parameters */
  arkls_mem->eplifac   = ARKLS_EPLIN;
  arkls_mem->last_flag = ARKLS_SUCCESS;

  /* If LS supports ATimes, attach ARKLs routine */
  if (LS->ops->setatimes)
  {
    retval = SUNLinSolSetATimes(LS, ark_mem, NULL);
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetATimes");
      free(arkls_mem);
      arkls_mem = NULL;
      return (ARKLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner)
  {
    retval = SUNLinSolSetPreconditioner(LS, ark_mem, NULL, NULL);
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetPreconditioner");
      free(arkls_mem);
      arkls_mem = NULL;
      return (ARKLS_SUNLS_FAIL);
    }
  }

  /* When using a non-NULL SUNMatrix object, store pointer to M and, for direct
     linear solvers, create M_lu to store the factorization of M */
  if (M != NULL)
  {
    arkls_mem->M = M;
    if (!iterative)
    {
      arkls_mem->M_lu = SUNMatClone(M);
      if (arkls_mem->M_lu == NULL)
      {
        arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_LS_MEM_FAIL);
        free(arkls_mem);
        arkls_mem = NULL;
        return (ARKLS_MEM_FAIL);
      }
    }
    else { arkls_mem->M_lu = M; }
  }

  /* Allocate memory for x */
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(arkls_mem->x)))
  {
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    if (!iterative) { SUNMatDestroy(arkls_mem->M_lu); }
    free(arkls_mem);
    arkls_mem = NULL;
    return (ARKLS_MEM_FAIL);
  }

  /* For iterative LS, compute default norm conversion factor */
  if (iterative) { arkls_mem->nrmfac = SUNRsqrt(N_VGetLength(arkls_mem->x)); }

  /* Attach ARKLs interface to time stepper module */
  retval = ark_mem->step_attachmasssol(ark_mem, arkLsMassInitialize,
                                       arkLsMassSetup, arkLsMTimes,
                                       arkLsMassSolve, arkLsMassFree, time_dep,
                                       LSType, arkls_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Failed to attach to time stepper module");
    N_VDestroy(arkls_mem->x);
    if (!iterative) { SUNMatDestroy(arkls_mem->M_lu); }
    free(arkls_mem);
    arkls_mem = NULL;
    return (retval);
  }

  return (ARKLS_SUCCESS);
}